

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O3

cmListFileBacktrace * __thiscall
cmGeneratorTarget::GetBacktrace(cmListFileBacktrace *__return_storage_ptr__,cmGeneratorTarget *this)

{
  pointer pcVar1;
  cmLinkedTree<cmState::SnapshotDataType> *pcVar2;
  cmListFileBacktrace *pcVar3;
  
  pcVar3 = cmTarget::GetBacktrace(this->Target);
  (__return_storage_ptr__->Context).Name._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->Context).Name.field_2;
  pcVar1 = (pcVar3->Context).Name._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar1,
             pcVar1 + (pcVar3->Context).Name._M_string_length);
  (__return_storage_ptr__->Context).Line = (pcVar3->Context).Line;
  pcVar2 = (pcVar3->Snapshot).Position.Tree;
  (__return_storage_ptr__->Snapshot).State = (pcVar3->Snapshot).State;
  (__return_storage_ptr__->Snapshot).Position.Tree = pcVar2;
  (__return_storage_ptr__->Snapshot).Position.Position = (pcVar3->Snapshot).Position.Position;
  return __return_storage_ptr__;
}

Assistant:

cmListFileBacktrace cmGeneratorTarget::GetBacktrace() const
{
  return this->Target->GetBacktrace();
}